

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise1D::load_param(ConvolutionDepthWise1D *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  ParamDict *in_stack_ffffffffffffff58;
  int local_4;
  
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,0);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,2,1);
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,3,1);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,4,0);
  *(int *)&in_RDI[3].refcount = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0xf,*(int *)&in_RDI[3].refcount);
  *(int *)((long)&in_RDI[3].refcount + 4) = iVar1;
  fVar2 = ParamDict::get((ParamDict *)in_RSI,0x12,0.0);
  *(float *)&in_RDI[3].elemsize = fVar2;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,5,0);
  *(int *)((long)&in_RDI[3].elemsize + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,6,0);
  in_RDI[3].elempack = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,7,1);
  *(int *)&in_RDI[3].field_0x1c = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,9,0);
  *(int *)&in_RDI[3].allocator = iVar1;
  this_00 = in_RSI;
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff58);
  ParamDict::get(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
  ncnn::Mat::operator=(this_00,in_RDI);
  ncnn::Mat::~Mat((Mat *)0x94e80e);
  ncnn::Mat::~Mat((Mat *)0x94e818);
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0x13,0);
  in_RDI[4].dims = iVar1;
  if (in_RDI[4].dims != 0) {
    *(undefined1 *)&in_RDI->refcount = 0;
  }
  if ((int)in_RDI[2].cstep % *(int *)&in_RDI[3].field_0x1c == 0) {
    local_4 = 0;
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise1D::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    dilation_w = pd.get(2, 1);
    stride_w = pd.get(3, 1);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_value = pd.get(18, 0.f);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    dynamic_weight = pd.get(19, 0);

    if (dynamic_weight)
    {
        one_blob_only = false;
    }

    if (num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    return 0;
}